

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffccls(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int ncols,int create_col,
          int *status)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int value;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int tstatus;
  int typecode;
  long orepeat;
  long repeat;
  long tfields;
  int otypecode;
  long owidth;
  long width;
  char keyname [75];
  char tform [71];
  char ttype [71];
  char tform_comm [73];
  char ttype_comm [73];
  char *tforms [1000];
  char *ttypes [1000];
  char keyarr [1001] [81];
  int iStack_17d68;
  int iStack_17d64;
  int iStack_17d5c;
  fitsfile *pfStack_17d58;
  int iStack_17d50;
  int iStack_17d4c;
  long lStack_17d48;
  ulong uStack_17d40;
  long lStack_17d38;
  long lStack_17d30;
  int aiStack_17d28 [3];
  int iStack_17d1c;
  long lStack_17d18;
  long lStack_17d10;
  char acStack_17d08 [80];
  char acStack_17cb8 [80];
  char acStack_17c68 [80];
  char acStack_17c18 [80];
  char acStack_17bc8 [80];
  char *apcStack_17b78 [1000];
  char *apcStack_15c38 [1000];
  char acStack_13cf8 [81096];
  
  if (0 < *status) {
    return *status;
  }
  uVar4 = (ulong)(uint)ncols;
  if (1000 < ncols) {
    *status = 0x6f;
    return 0x6f;
  }
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar1 = infptr->Fptr->hdutype;
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar6 = outfptr->Fptr->hdutype;
  if (iVar6 == 0 || iVar1 == 0) {
    ffpmsg("Can not copy columns to or from IMAGE HDUs (ffccls)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((iVar6 == 1 && iVar1 == 2) || (iVar6 == 2 && iVar1 == 1)) {
    pcVar5 = "Copying between Binary and ASCII tables is not supported (ffccls)";
LAB_0013fc8c:
    ffpmsg(pcVar5);
    *status = 0xe3;
    return 0xe3;
  }
  if ((infptr->Fptr == outfptr->Fptr) && (infptr->HDUposition == outfptr->HDUposition)) {
    pcVar5 = "Copying multiple columns in same HDU is not supported (ffccls)";
    goto LAB_0013fc8c;
  }
  iStack_17d5c = 0;
  iVar1 = ffgkyj(outfptr,"TFIELDS",(long *)aiStack_17d28,(char *)0x0,&iStack_17d5c);
  if (iVar1 != 0) {
    ffpmsg("Could not read TFIELDS keyword in output table (ffccls)");
    *status = 0xe6;
    return 0xe6;
  }
  aiStack_17d28[0] = aiStack_17d28[0] + 1;
  iVar1 = outcol;
  if (aiStack_17d28[0] < outcol) {
    iVar1 = aiStack_17d28[0];
  }
  if (0 < ncols) {
    lStack_17d48 = (long)aiStack_17d28[0];
    if ((long)outcol < (long)aiStack_17d28[0]) {
      lStack_17d48 = (long)outcol;
    }
    pfStack_17d58 = (fitsfile *)(ulong)(uint)incol;
    uVar7 = 0;
    iStack_17d68 = 0;
    iStack_17d50 = create_col;
    uStack_17d40 = uVar4;
    do {
      iVar6 = (int)uVar7 + (int)pfStack_17d58;
      ffgtcl(infptr,iVar6,&iStack_17d4c,&lStack_17d30,&lStack_17d10,status);
      if (iStack_17d4c < 0) {
        pcVar5 = "Variable-length columns are not supported (ffccls)";
LAB_00140243:
        ffpmsg(pcVar5);
        *status = 0x105;
        return 0x105;
      }
      iStack_17d5c = 0;
      ffkeyn("TTYPE",iVar6,acStack_17d08,&iStack_17d5c);
      ffgkys(infptr,acStack_17d08,acStack_17c68,acStack_17bc8,&iStack_17d5c);
      ffkeyn("TFORM",iVar6,acStack_17d08,&iStack_17d5c);
      iVar6 = ffgkys(infptr,acStack_17d08,acStack_17cb8,acStack_17c18,&iStack_17d5c);
      if (iVar6 != 0) {
        ffpmsg("Could not find TTYPE and TFORM keywords in input table (ffccls)");
        *status = 0xe8;
        return 0xe8;
      }
      if (create_col == 0) {
        ffgtcl(outfptr,(int)lStack_17d48 + (int)uVar7,&iStack_17d1c,&lStack_17d38,&lStack_17d18,
               status);
        if (lStack_17d38 != lStack_17d30) {
          pcVar5 = "Input and output vector columns must have same length (ffccls)";
          goto LAB_00140243;
        }
      }
      else {
        lVar3 = (long)iStack_17d68;
        iVar6 = iStack_17d68 + 1;
        apcStack_17b78[uVar7] = acStack_13cf8 + lVar3 * 0x51;
        iStack_17d68 = iStack_17d68 + 2;
        apcStack_15c38[uVar7] = acStack_13cf8 + (long)iVar6 * 0x51;
        strcpy(acStack_13cf8 + lVar3 * 0x51,acStack_17cb8);
        strcpy(acStack_13cf8 + (long)iVar6 * 0x51,acStack_17c68);
        create_col = iStack_17d50;
      }
      uVar7 = uVar7 + 1;
    } while (uStack_17d40 != uVar7);
  }
  if (create_col != 0) {
    iVar6 = fficls(outfptr,iVar1,ncols,apcStack_15c38,apcStack_17b78,status);
    if (0 < iVar6) {
      ffpmsg("Could not append new columns to output file (ffccls)");
      goto LAB_00140235;
    }
    uVar7 = uVar4;
    iVar6 = iVar1;
    value = incol;
    pfStack_17d58 = infptr;
    if (0 < ncols) {
      do {
        ffkeyn("TTYPE",value,acStack_17d08,status);
        ffgkys(infptr,acStack_17d08,acStack_17c68,acStack_17bc8,status);
        ffkeyn("TTYPE",iVar6,acStack_17d08,status);
        ffmcom(outfptr,acStack_17d08,acStack_17bc8,status);
        ffkeyn("TFORM",value,acStack_17d08,status);
        ffgkys(infptr,acStack_17d08,acStack_17cb8,acStack_17c18,status);
        ffkeyn("TFORM",iVar6,acStack_17d08,status);
        ffmcom(outfptr,acStack_17d08,acStack_17c18,status);
        ffcpky(infptr,outfptr,value,iVar6,"TUNIT",status);
        ffcpky(infptr,outfptr,value,iVar6,"TSCAL",status);
        ffcpky(infptr,outfptr,value,iVar6,"TZERO",status);
        ffcpky(infptr,outfptr,value,iVar6,"TDISP",status);
        ffcpky(infptr,outfptr,value,iVar6,"TLMIN",status);
        ffcpky(infptr,outfptr,value,iVar6,"TLMAX",status);
        ffcpky(infptr,outfptr,value,iVar6,"TDIM",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCTYP",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCUNI",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCRVL",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCRPX",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCDLT",status);
        ffcpky(infptr,outfptr,value,iVar6,"TCROT",status);
        ffcpky(infptr,outfptr,value,iVar6,"TNULL",status);
        uVar2 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar2;
        iVar6 = iVar6 + 1;
        value = value + 1;
      } while (uVar2 != 0);
    }
    iVar6 = ffrdef(outfptr,status);
    infptr = pfStack_17d58;
    if (iVar6 != 0) {
      return *status;
    }
  }
  iStack_17d64 = incol;
  if (0 < ncols) {
    do {
      ffcpcl(infptr,outfptr,iStack_17d64,iVar1,0,status);
      iStack_17d64 = iStack_17d64 + 1;
      iVar1 = iVar1 + 1;
      uVar2 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
LAB_00140235:
  return *status;
}

Assistant:

int ffccls(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of first input column   */
           int outcol,          /* I - number for first output column  */
	   int ncols,           /* I - number of columns to copy from input to output */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy multiple columns from infptr and insert them in the outfptr
  table.  Optimized for multiple-column case since it only expands the
  output file once using fits_insert_cols() instead of calling
  fits_insert_col() multiple times.
*/
{
    int tstatus, colnum, typecode, otypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    int typecodes[1000];
    char *ttypes[1000], *tforms[1000], keyarr[1001][FLEN_CARD];
    int ikey = 0;
    int icol, incol1, outcol1;

    if (*status > 0)
        return(*status);

    /* Do not allow more than internal array limit to be copied */
    if (ncols > 1000) return (*status = ARRAY_TOO_BIG);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffccls)");
       return(*status = NOT_TABLE);
    }

    if ( (inHduType == BINARY_TBL &&  outHduType == ASCII_TBL) ||
	 (inHduType == ASCII_TBL  &&  outHduType == BINARY_TBL) )
    {
       ffpmsg
       ("Copying between Binary and ASCII tables is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Do not allow copying multiple columns in the same HDU because the
       permutations of possible overlapping copies is mind-bending */
    if ((infptr->Fptr == outfptr->Fptr)
	&& (infptr->HDUposition == outfptr->HDUposition))
    {
       ffpmsg
       ("Copying multiple columns in same HDU is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Retrieve the number of columns in output file */
    tstatus=0;
    if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
    {
      ffpmsg
	("Could not read TFIELDS keyword in output table (ffccls)");
      return(*status = NO_TFIELDS);
    }

    colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

    /* Collect data about input column (type, repeat, etc) */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffgtcl(infptr, incol1, &typecode, &repeat, &width, status);

      if (typecode < 0)
	{
	  ffpmsg("Variable-length columns are not supported (ffccls)");
	  return(*status = BAD_TFORM);
	}

      typecodes[icol] = typecode;

      tstatus = 0;
      ffkeyn("TTYPE", incol1, keyname, &tstatus);
      ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);

      ffkeyn("TFORM", incol1, keyname, &tstatus);
    
      if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
	    ("Could not find TTYPE and TFORM keywords in input table (ffccls)");
          return(*status = NO_TFORM);
        }

      /* If creating columns, we need to save these values */
      if ( create_col ) {
	tforms[icol] = keyarr[ikey++];
	ttypes[icol] = keyarr[ikey++];

	strcpy(tforms[icol], tform);
	strcpy(ttypes[icol], ttype);
      } else {
	/* If not creating columns, then check the datatype and vector
	   repeat length of the output column */
        ffgtcl(outfptr, outcol1, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffccls)");
            return(*status = BAD_TFORM);
        }
      }
    }

    /* Insert columns into output file and copy all meta-data
       keywords, if requested */
    if (create_col)
    {
        /* create the empty columns */
        if (fficls(outfptr, colnum, ncols, ttypes, tforms, status) > 0)
        {
           ffpmsg
           ("Could not append new columns to output file (ffccls)");
           return(*status);
        }

	/* Copy meta-data strings from input column to output */
	for (incol1 = incol, outcol1 = colnum, icol = 0; 
	     icol < ncols; 
	     icol++, incol1++, outcol1++)
	{
	  /* copy the comment strings from the input file for TTYPE and TFORM */
	  ffkeyn("TTYPE", incol1, keyname, status);
	  ffgkys(infptr, keyname, ttype, ttype_comm, status);
	  ffkeyn("TTYPE", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, ttype_comm, status);
	  
	  ffkeyn("TFORM", incol1, keyname, status);
	  ffgkys(infptr, keyname, tform, tform_comm, status);
	  ffkeyn("TFORM", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, tform_comm, status);
	  
	  /* copy other column-related keywords if they exist */
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TUNIT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TSCAL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TZERO", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDISP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMIN", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMAX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDIM", status);

	  /*  WCS keywords */
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCTYP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCUNI", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRVL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRPX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCDLT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCROT", status);
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TNULL", status);

	}

	/* rescan header to recognize the new keywords */
	if (ffrdef(outfptr, status) )
	  return(*status);
    }
	
    /* Copy columns using standard ffcpcl(); do this in a loop because
       the I/O-intensive column expanding is done */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffcpcl(infptr, outfptr, incol1, outcol1, 0, status);
    }

    return(*status);
}